

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.cpp
# Opt level: O2

void __thiscall DecHeap::trickle_down(DecHeap *this,size_t idx)

{
  ulong uVar1;
  pointer ppVar2;
  ulong uVar3;
  ulong uVar4;
  size_t min_idx;
  ulong b;
  
  while( true ) {
    uVar1 = idx * 2 + 1;
    ppVar2 = (this->heap).
             super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar4 = (long)(this->heap).
                  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar2 >> 4;
    if (uVar4 <= uVar1) {
      return;
    }
    uVar3 = idx * 2 + 2;
    b = uVar1;
    if ((uVar3 < uVar4) && (b = uVar3, ppVar2[uVar1].first <= ppVar2[uVar3].first)) {
      b = uVar1;
    }
    if (ppVar2[idx].first <= ppVar2[b].first) break;
    swap(this,idx,b);
    idx = b;
  }
  return;
}

Assistant:

void DecHeap::trickle_down(size_t idx) {
    while ((idx * 2 + 1) < heap.size()) {
        auto min_idx = idx * 2 + 1;
        if ((idx * 2 + 2) < heap.size() && heap[idx * 2 + 2].first < heap[idx * 2 + 1].first) {
            min_idx += 1;
        }
        if (heap[min_idx].first < heap[idx].first) {
            this->swap(idx, min_idx);
            idx = min_idx;
        } else {
            break;
        }
    }
}